

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cautious_this_capture_cpp_pre17.cpp
# Opt level: O0

int main(void)

{
  Prefixer *this;
  allocator<char> local_79;
  string local_78;
  undefined1 local_48 [8];
  anon_class_32_1_66b8a3d0 print;
  Prefixer prefixer;
  
  this = (Prefixer *)((long)&print.prefix.field_2 + 8);
  Prefixer::Prefixer(this);
  Prefixer::printer_abi_cxx11_((anon_class_32_1_66b8a3d0 *)local_48,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Mortals",&local_79);
  anon_class_32_1_66b8a3d0::operator()((anon_class_32_1_66b8a3d0 *)local_48,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  Prefixer::printer[abi:cxx11]()::{lambda(std::__cxx11::string)#1}::~basic_string
            ((_lambda_std____cxx11__string__1_ *)local_48);
  Prefixer::~Prefixer((Prefixer *)((long)&print.prefix.field_2 + 8));
  return 0;
}

Assistant:

int main() {
  Prefixer prefixer;
  auto print = prefixer.printer();
  print("Mortals");
}